

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

bool __thiscall
acto::actor_ref::send<msg_out,std::__cxx11::string>
          (actor_ref *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p)

{
  undefined1 local_30 [8];
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_28;
  undefined1 local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_local;
  actor_ref *this_local;
  
  if (this->object_ == (object_t *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_20 = (undefined1  [8])p;
    p_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
    std::make_unique<acto::core::msg_wrap_t<msg_out>,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>>::
    unique_ptr<acto::core::msg_wrap_t<msg_out>,std::default_delete<acto::core::msg_wrap_t<msg_out>>,void>
              ((unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>> *)&local_28,
               (unique_ptr<acto::core::msg_wrap_t<msg_out>,_std::default_delete<acto::core::msg_wrap_t<msg_out>_>_>
                *)local_30);
    this_local._7_1_ = send_message(this,&local_28);
    std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
              (&local_28);
    std::
    unique_ptr<acto::core::msg_wrap_t<msg_out>,_std::default_delete<acto::core::msg_wrap_t<msg_out>_>_>
    ::~unique_ptr((unique_ptr<acto::core::msg_wrap_t<msg_out>,_std::default_delete<acto::core::msg_wrap_t<msg_out>_>_>
                   *)local_30);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool send(P&&... p) const {
    if (!object_) {
      return false;
    }

    return send_message(
      std::make_unique<core::msg_wrap_t<std::remove_cvref_t<Msg>>>(
        std::forward<P>(p)...));
  }